

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O2

int __thiscall bdHashSet::modify(bdHashSet *this,string *key,bdHashEntry *entry,uint32_t modFlags)

{
  __type _Var1;
  bool bVar2;
  iterator __position;
  iterator iVar3;
  time_t store;
  _Base_ptr p_Var4;
  byte bVar5;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
  *this_00;
  _Self __tmp;
  string local_130;
  string local_110;
  bdHashEntry newEntry;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>
  local_a0;
  
  this_00 = &this->mEntries;
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
               ::lower_bound(&this_00->_M_t,key);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
          ::upper_bound(&this_00->_M_t,key);
  bVar5 = 0;
  store = time((time_t *)0x0);
  do {
    if (__position._M_node == iVar3._M_node) {
      if (modFlags == 1 && bVar5 == 0) {
        std::__cxx11::string::string((string *)&local_110,(string *)entry);
        std::__cxx11::string::string((string *)&local_130,(string *)&entry->mSecret);
        bdHashEntry::bdHashEntry(&newEntry,&local_110,&local_130,entry->mLifetime,store);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bdHashEntry_&,_true>
                  (&local_a0,key,&newEntry);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bdHashEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bdHashEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
        ::_M_emplace_equal<std::pair<std::__cxx11::string,bdHashEntry>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bdHashEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bdHashEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
                    *)this_00,&local_a0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>
        ::~pair(&local_a0);
        bdHashEntry::~bdHashEntry(&newEntry);
        bVar5 = 1;
      }
      return (uint)bVar5;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (__position._M_node + 2),&entry->mValue);
    if (_Var1) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__position._M_node[3]._M_parent,"");
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__position._M_node[3]._M_parent,&entry->mSecret);
      if (bVar2 && _Var1) {
        if ((modFlags == 1) &&
           (p_Var4 = (_Base_ptr)entry->mLifetime,
           (long)&(__position._M_node[4]._M_parent)->_M_color + *(long *)(__position._M_node + 3) <
           (long)&p_Var4->_M_color + store)) {
LAB_00125cf0:
          *(time_t *)(__position._M_node + 3) = store;
          __position._M_node[4]._M_parent = p_Var4;
          bVar5 = 1;
        }
      }
      else if (_Var1) {
        if (modFlags == 1) {
          p_Var4 = (_Base_ptr)entry->mLifetime;
          goto LAB_00125cf0;
        }
        if (modFlags == 2) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bdHashEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bdHashEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
          ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bdHashEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,bdHashEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bdHashEntry>>>
                              *)this_00,__position);
          return 1;
        }
      }
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

int 	bdHashSet::modify(std::string key, bdHashEntry *entry, uint32_t modFlags) {
	std::multimap<std::string, bdHashEntry>::iterator sit, eit, it;
        sit = mEntries.lower_bound(key);
        eit = mEntries.upper_bound(key);

	time_t now = time(NULL);

	bool updated = false;
	for (it = sit; it != eit; it++) {
		/* check it all */
		if (it->second.mValue == entry->mValue) {
			bool noSecret = (it->second.mSecret == "");
			bool sameSecret = (it->second.mSecret == entry->mSecret);
			bool update = false;

			if (noSecret && sameSecret) {
				/* only allowed to increase lifetime */
				if (modFlags == BITDHT_HASH_ENTRY_ADD) {
					time_t existKillTime = it->second.mLifetime + it->second.mStoreTS;
					time_t newKillTime = entry->mLifetime + now;
					if (newKillTime > existKillTime) {
						update = true;
					}
				}
			}
			else if (sameSecret) {
				if (modFlags == BITDHT_HASH_ENTRY_ADD) {
					update = true;
				}
				else if (modFlags == BITDHT_HASH_ENTRY_DELETE) {
					/* do it here */
					mEntries.erase(it);
					return 1;
				}
			}
			
			if (update) {
				it->second.mStoreTS = now;
				it->second.mLifetime = entry->mLifetime;
				updated = true;
			}
		}
	}

	if ((!updated) && (modFlags == BITDHT_HASH_ENTRY_ADD)) {
		/* create a new entry */
		bdHashEntry newEntry(entry->mValue, entry->mSecret, entry->mLifetime, now);
	        mEntries.insert(std::pair<std::string, bdHashEntry>(key, newEntry));
		updated = true;
	}
	return updated;
}